

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

bool __thiscall kws::Parser::Check(Parser *this,char *name,char *value)

{
  undefined8 __nptr;
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t posPrivate;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  undefined8 uVar10;
  char **__endptr;
  bool bVar11;
  bool bVar12;
  string val;
  string v2;
  string v1;
  string v3;
  string v4;
  string v5;
  string v6;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  Parser *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  ulong local_78;
  _Alloc_hider local_70 [2];
  char local_60 [16];
  _Alloc_hider local_50 [2];
  char local_40 [16];
  
  iVar1 = strcmp(name,"LineLength");
  if (iVar1 == 0) {
    std::__cxx11::string::string((string *)local_138,value,(allocator *)local_118);
    uVar10 = local_138._0_8_;
    value = (char *)__errno_location();
    __endptr = (char **)(ulong)*(uint *)value;
    *(uint *)value = 0;
    uVar9 = strtoul((char *)uVar10,(char **)local_f8,10);
    if (local_f8._0_8_ != uVar10) {
      if (*(uint *)value == 0) {
LAB_00120e94:
        *(uint *)value = (uint)__endptr;
      }
      else if (*(uint *)value == 0x22) {
        std::__throw_out_of_range("stoul");
        goto LAB_00120e26;
      }
      CheckLineLength(this,uVar9,false,true);
      goto LAB_0012168f;
    }
    std::__throw_invalid_argument("stoul");
LAB_00122639:
    std::__throw_invalid_argument("stoul");
LAB_00122645:
    std::__throw_invalid_argument("stoul");
LAB_00122651:
    std::__throw_invalid_argument("stoul");
LAB_0012265d:
    uVar10 = std::__throw_invalid_argument("stoul");
    _Unwind_Resume(uVar10);
  }
  if ((this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    CheckLineLength(this,0,false,false);
  }
  iVar1 = strcmp(name,"DeclarationOrder");
  if (iVar1 == 0) {
LAB_00120e26:
    std::__cxx11::string::string((string *)local_138,value,(allocator *)local_b8);
    uVar10 = local_138._0_8_;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    __endptr = (char **)local_f8;
    uVar6 = strtoul((char *)uVar10,__endptr,10);
    if (local_f8._0_8_ == uVar10) goto LAB_00122639;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    else if (*piVar5 == 0x22) {
      uVar9 = std::__throw_out_of_range("stoul");
      this = (Parser *)uVar10;
      goto LAB_00120e94;
    }
    local_f8._0_8_ = local_f8 + 0x10;
    local_78 = uVar6;
    sVar4 = strlen((char *)((long)value + 2));
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,(char *)((long)value + 2),(long)value + sVar4 + 2);
    uVar10 = local_f8._0_8_;
    iVar1 = *piVar5;
    *piVar5 = 0;
    uVar6 = strtoul((char *)local_f8._0_8_,(char **)local_118,10);
    if (local_118._0_8_ == uVar10) goto LAB_00122645;
    if (*piVar5 == 0) {
LAB_00120fe0:
      *piVar5 = iVar1;
    }
    else if (*piVar5 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_00120fe0;
    }
    local_118._0_8_ = (Parser *)(local_118 + 0x10);
    sVar4 = strlen((char *)((long)value + 4));
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,(uint *)((long)value + 4),(long)value + sVar4 + 4);
    uVar10 = local_118._0_8_;
    iVar1 = *piVar5;
    *piVar5 = 0;
    posPrivate = strtoul((char *)local_118._0_8_,(char **)local_d8,10);
    if (local_d8._0_8_ == uVar10) goto LAB_00122651;
    if (*piVar5 == 0) {
LAB_00121052:
      *piVar5 = iVar1;
    }
    else if (*piVar5 == 0x22) {
      posPrivate = std::__throw_out_of_range("stoul");
      goto LAB_00121052;
    }
    CheckDeclarationOrder(this,local_78,uVar6,posPrivate);
    if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_);
    }
  }
  else {
    iVar1 = strcmp(name,"Typedefs");
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
      lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
      if (lVar7 == -1) {
        bVar11 = true;
      }
      else {
        std::__cxx11::string::substr((ulong)local_f8,(ulong)local_138);
        lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
        local_118._0_8_ = (Parser *)(local_118 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
        if (lVar7 == -1) {
          std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
        }
        else {
          std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
        }
        std::__cxx11::string::operator=((string *)local_118,(string *)local_d8);
        if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        uVar10 = local_118._0_8_;
        iVar1 = strcmp((char *)local_118._0_8_,"false");
        if (iVar1 == 0) {
LAB_001211ee:
          bVar11 = false;
        }
        else {
          iVar1 = strcmp((char *)uVar10,"0");
          bVar11 = true;
          if (iVar1 == 0) goto LAB_001211ee;
        }
        std::__cxx11::string::_M_assign((string *)local_138);
        if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_);
        }
        if ((Parser *)local_f8._0_8_ != (Parser *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_);
        }
      }
      CheckTypedefs(this,(char *)local_138._0_8_,bVar11,0x51);
      goto LAB_0012168f;
    }
    iVar1 = strcmp(name,"InternalVariables");
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
      bVar11 = false;
      lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
      if (lVar7 == -1) {
        bVar12 = true;
      }
      else {
        std::__cxx11::string::substr((ulong)local_f8,(ulong)local_138);
        piVar5 = (int *)std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
        local_118._0_8_ = local_118 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
        if (piVar5 == (int *)0xffffffffffffffff) {
LAB_0012138e:
          std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
        }
        else {
          std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
        }
        std::__cxx11::string::operator=((string *)local_118,(string *)local_d8);
        if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        uVar10 = local_118._0_8_;
        iVar1 = strcmp((char *)local_118._0_8_,"false");
        if (iVar1 == 0) {
LAB_001213fc:
          bVar12 = false;
        }
        else {
          iVar1 = strcmp((char *)uVar10,"0");
          bVar12 = true;
          if (iVar1 == 0) goto LAB_001213fc;
        }
        if (piVar5 == (int *)0xffffffffffffffff) {
          bVar11 = false;
        }
        else {
          lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,(long)piVar5 + 1);
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
          if (lVar7 == -1) {
            std::__cxx11::string::substr((ulong)local_b8,(ulong)local_138);
          }
          else {
            std::__cxx11::string::substr((ulong)local_b8,(ulong)local_138);
          }
          std::__cxx11::string::operator=((string *)local_d8,(string *)local_b8);
          if (local_b8[0] != (Parser *)local_a8) {
            operator_delete(local_b8[0]);
          }
          uVar10 = local_d8._0_8_;
          iVar1 = strcmp((char *)local_d8._0_8_,"true");
          if ((iVar1 == 0) || (iVar1 = strcmp((char *)uVar10,"1"), iVar1 == 0)) {
            bVar11 = true;
          }
          else {
            bVar11 = false;
          }
          if ((Parser *)uVar10 != (Parser *)(local_d8 + 0x10)) {
            operator_delete((void *)uVar10);
          }
        }
        std::__cxx11::string::_M_assign((string *)local_138);
        if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_);
        }
        if ((Parser *)local_f8._0_8_ != (Parser *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_);
        }
      }
      CheckInternalVariables(this,(char *)local_138._0_8_,bVar12,bVar11);
      goto LAB_0012168f;
    }
    iVar1 = strcmp(name,"Variables");
    if (iVar1 == 0) {
      CheckVariables(this,value);
      return true;
    }
    iVar1 = strcmp(name,"Struct");
    if (iVar1 == 0) {
      CheckStruct(this,value,true);
      return true;
    }
    iVar1 = strcmp(name,"MemberFunctions");
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
      std::__cxx11::string::string((string *)local_f8,value,(allocator *)local_118);
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"0","");
      lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
      if (lVar7 != -1) {
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
        std::__cxx11::string::operator=((string *)local_f8,(string *)local_d8);
        if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
        std::__cxx11::string::operator=((string *)local_118,(string *)local_d8);
        if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
      uVar10 = local_f8._0_8_;
      std::__cxx11::string::string
                ((string *)local_d8,(char *)local_118._0_8_,(allocator *)(local_a8 + 0x10));
      __nptr = local_d8._0_8_;
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      *piVar5 = 0;
      uVar6 = strtoul((char *)__nptr,(char **)local_b8,10);
      if (local_b8[0] == (Parser *)__nptr) goto LAB_0012265d;
      if (*piVar5 == 0) {
        *piVar5 = iVar1;
      }
      else if (*piVar5 == 0x22) {
        std::__throw_out_of_range("stoul");
        goto LAB_0012138e;
      }
      CheckMemberFunctions(this,(char *)uVar10,uVar6);
      if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
LAB_001216ea:
      if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
LAB_001216ef:
        operator_delete((void *)local_118._0_8_);
      }
    }
    else {
      iVar1 = strcmp(name,"Functions");
      if (iVar1 != 0) {
        iVar1 = strcmp(name,"SemicolonSpace");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
          uVar9 = std::__cxx11::stoul((string *)local_138,(size_t *)0x0,10);
          CheckSemicolonSpace(this,uVar9);
          goto LAB_0012168f;
        }
        iVar1 = strcmp(name,"EndOfFileNewLine");
        if (iVar1 == 0) {
          CheckEndOfFileNewLine(this);
          return true;
        }
        iVar1 = strcmp(name,"Tabs");
        if (iVar1 == 0) {
          CheckTabs(this);
          return true;
        }
        iVar1 = strcmp(name,"Spaces");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
          uVar9 = std::__cxx11::stoul((string *)local_138,(size_t *)0x0,10);
          CheckExtraSpaces(this,uVar9,false);
          goto LAB_0012168f;
        }
        iVar1 = strcmp(name,"StatementPerLine");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
          std::__cxx11::string::string((string *)local_f8,value,(allocator *)local_118);
          lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
          if (lVar7 == -1) {
            bVar11 = true;
          }
          else {
            std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
            std::__cxx11::string::operator=((string *)local_f8,(string *)local_118);
            if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_);
            }
            std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
            iVar1 = std::__cxx11::string::compare(local_118);
            bVar11 = iVar1 != 0;
            if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_);
            }
          }
          std::__cxx11::string::string
                    ((string *)local_118,(char *)local_f8._0_8_,(allocator *)local_d8);
          uVar9 = std::__cxx11::stoul((string *)local_118,(size_t *)0x0,10);
          CheckStatementPerLine(this,uVar9,bVar11);
          goto LAB_001216ea;
        }
        iVar1 = strcmp(name,"BadCharacters");
        if (iVar1 == 0) {
          iVar1 = strcmp(value,"true");
          CheckBadCharacters(this,iVar1 == 0);
          return true;
        }
        iVar1 = strcmp(name,"VariablePerLine");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
          uVar9 = std::__cxx11::stoul((string *)local_138,(size_t *)0x0,10);
          CheckVariablePerLine(this,uVar9);
          goto LAB_0012168f;
        }
        iVar1 = strcmp(name,"Comments");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
          lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
          if (lVar7 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Comments not defined correctly",0x1e);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            bVar11 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)local_f8,(ulong)local_138);
            lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
            if (lVar7 == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Comments not defined correctly",0x1e);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              bVar11 = false;
            }
            else {
              std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
              lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
              bVar11 = lVar7 != -1;
              if (lVar7 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Comments not defined correctly",0x1e);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              else {
                std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
                lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
                local_b8[0] = (Parser *)local_a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"");
                if (lVar7 == -1) {
                  std::__cxx11::string::substr((ulong)(local_a8 + 0x10),(ulong)local_138);
                }
                else {
                  std::__cxx11::string::substr((ulong)(local_a8 + 0x10),(ulong)local_138);
                }
                std::__cxx11::string::operator=((string *)local_b8,(string *)(local_a8 + 0x10));
                if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
                  operator_delete((void *)local_98._0_8_);
                }
                iVar1 = strcmp((char *)local_b8[0],"true");
                local_78 = CONCAT44(local_78._4_4_,iVar1);
                lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
                local_98._0_8_ = local_98 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 0x10),"");
                if (lVar7 == -1) {
                  std::__cxx11::string::substr((ulong)local_70,(ulong)local_138);
                }
                else {
                  std::__cxx11::string::substr((ulong)local_70,(ulong)local_138);
                }
                std::__cxx11::string::operator=((string *)(local_a8 + 0x10),(string *)local_70);
                if (local_70[0]._M_p != local_60) {
                  operator_delete(local_70[0]._M_p);
                }
                iVar1 = strcmp((char *)local_98._0_8_,"false");
                std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
                local_70[0]._M_p = local_60;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
                if (lVar7 == -1) {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)local_138);
                }
                else {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)local_138);
                }
                std::__cxx11::string::operator=((string *)local_70,(string *)local_50);
                if (local_50[0]._M_p != local_40) {
                  operator_delete(local_50[0]._M_p);
                }
                bVar12 = (int)local_78 == 0;
                iVar2 = strcmp(local_70[0]._M_p,"false");
                CheckComments(this,(char *)local_f8._0_8_,(char *)local_118._0_8_,
                              (char *)local_d8._0_8_,bVar12,iVar1 != 0,iVar2 != 0);
                if (local_70[0]._M_p != local_60) {
                  operator_delete(local_70[0]._M_p);
                }
                if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
                  operator_delete((void *)local_98._0_8_);
                }
                if (local_b8[0] != (Parser *)local_a8) {
                  operator_delete(local_b8[0]);
                }
                if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
                  operator_delete((void *)local_d8._0_8_);
                }
              }
              if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
                operator_delete((void *)local_118._0_8_);
              }
            }
            if ((Parser *)local_f8._0_8_ != (Parser *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_);
            }
          }
          if ((Parser *)local_138._0_8_ != (Parser *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
            return bVar11;
          }
          return bVar11;
        }
        iVar1 = strcmp(name,"Header");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
          lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
          if (lVar7 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Header not defined correctly",0x1c);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            goto LAB_00122519;
          }
          local_f8._0_8_ = local_f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
          if (lVar7 != 0) {
            std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
            std::__cxx11::string::operator=((string *)local_f8,(string *)local_118);
            if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_);
            }
          }
          lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
          if (lVar7 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Header not defined correctly",0x1c);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          else {
            std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
            std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
            if (local_f8._8_8_ != 0) {
              iVar1 = strcmp((char *)local_d8._0_8_,"true");
              iVar2 = strcmp((char *)local_118._0_8_,"true");
              CheckHeader(this,(char *)local_f8._0_8_,iVar2 == 0,iVar1 == 0);
            }
            if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_);
            }
            if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_);
            }
          }
        }
        else {
          iVar1 = strcmp(name,"Indent");
          if (iVar1 == 0) {
            std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
            lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
            if (lVar7 == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Indent not defined correctly",0x1c);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              goto LAB_00122519;
            }
            std::__cxx11::string::substr((ulong)local_f8,(ulong)local_138);
            lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
            if (lVar7 != -1) {
              std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
              lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,lVar7 + 1);
              if (lVar7 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Indent not defined correctly",0x1c);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              else {
                std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
                std::__cxx11::string::substr((ulong)local_b8,(ulong)local_138);
                iVar1 = strcmp((char *)local_d8._0_8_,"true");
                iVar2 = strcmp((char *)local_b8[0],"true");
                iVar3 = strcmp((char *)local_f8._0_8_,"TAB");
                std::__cxx11::string::string
                          ((string *)(local_a8 + 0x10),(char *)local_118._0_8_,(allocator *)local_70
                          );
                uVar9 = std::__cxx11::stoul((string *)(local_a8 + 0x10),(size_t *)0x0,10);
                CheckIndent(this,(uint)(iVar3 == 0),uVar9,iVar1 == 0,iVar2 == 0,0x51,true);
                if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
                  operator_delete((void *)local_98._0_8_);
                }
                if (local_b8[0] != (Parser *)local_a8) {
                  operator_delete(local_b8[0]);
                }
                if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
                  operator_delete((void *)local_d8._0_8_);
                }
              }
              goto LAB_001224f3;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Indent not defined correctly",0x1c);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          else {
            iVar1 = strcmp(name,"Namespace");
            if (iVar1 == 0) {
              CheckNamespace(this,value,true);
              return false;
            }
            iVar1 = strcmp(name,"NameOfClass");
            if (iVar1 == 0) {
              std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
              lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
              if (lVar7 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"NameOfClass not defined correctly",0x21);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                goto LAB_00122519;
              }
              std::__cxx11::string::substr((ulong)local_f8,(ulong)local_138);
              std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
              CheckNameOfClass(this,(char *)local_f8._0_8_,(char *)local_118._0_8_);
            }
            else {
              iVar1 = strcmp(name,"IfNDefDefine");
              if (iVar1 == 0) {
                std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
                std::__cxx11::string::string((string *)local_f8,value,(allocator *)local_118);
                bVar11 = false;
                lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
                if (lVar7 != -1) {
                  std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
                  std::__cxx11::string::operator=((string *)local_f8,(string *)local_118);
                  if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
                    operator_delete((void *)local_118._0_8_);
                  }
                  std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
                  iVar1 = std::__cxx11::string::compare(local_118);
                  if (iVar1 == 0) {
                    bVar11 = true;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare(local_118);
                    bVar11 = iVar1 == 0;
                  }
                  if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
                    operator_delete((void *)local_118._0_8_);
                  }
                }
                CheckIfNDefDefine(this,(char *)local_f8._0_8_,bVar11);
                goto LAB_0012250f;
              }
              iVar1 = strcmp(name,"EmptyLines");
              if (iVar1 == 0) {
                std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
                uVar9 = std::__cxx11::stoul((string *)local_138,(size_t *)0x0,10);
                CheckEmptyLines(this,uVar9,false);
                goto LAB_00122519;
              }
              iVar1 = strcmp(name,"Template");
              if (iVar1 == 0) {
                CheckTemplate(this,value);
                return false;
              }
              iVar1 = strcmp(name,"Operator");
              if (iVar1 == 0) {
                std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
                lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
                if (lVar7 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Operator not defined correctly",0x1e);
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  goto LAB_00122519;
                }
                std::__cxx11::string::substr((ulong)local_f8,(ulong)local_138);
                std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
                uVar9 = std::__cxx11::stoul((string *)local_f8,(size_t *)0x0,10);
                uVar8 = std::__cxx11::stoul((string *)local_118,(size_t *)0x0,10);
                CheckOperator(this,(uint)uVar9,(uint)uVar8,0x51,true);
              }
              else {
                iVar1 = strcmp(name,"Comma");
                if (iVar1 != 0) {
                  iVar1 = strcmp(name,"Parenthesis");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(name,"IfWhileForUntil");
                    if (iVar1 == 0) {
                      std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
                      uVar9 = std::__cxx11::stoul((string *)local_138,(size_t *)0x0,10);
                      CheckIfWhileForUntil(this,(uint)uVar9);
                      goto LAB_00122519;
                    }
                    iVar1 = strcmp(name,"BlackList");
                    if (iVar1 == 0) {
                      CheckBlackList(this,value);
                      return false;
                    }
                    iVar1 = strcmp(name,"UsingDirectives");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(name,"RelativePathInInclude");
                      if (iVar1 != 0) {
                        return false;
                      }
                      iVar1 = strcmp(value,"0");
                      if (iVar1 != 0) {
                        iVar1 = strcmp(value,"false");
                        bVar11 = true;
                        if (iVar1 != 0) goto LAB_00120db8;
                      }
                      bVar11 = false;
LAB_00120db8:
                      CheckRelativePathInInclude(this,bVar11);
                      return false;
                    }
                    iVar1 = strcmp(value,"0");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(value,"false");
                      bVar11 = true;
                      if (iVar1 != 0) goto LAB_0012261d;
                    }
                    bVar11 = false;
LAB_0012261d:
                    CheckUsingDirectives(this,bVar11);
                    return false;
                  }
                  std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
                  uVar9 = std::__cxx11::stoul((string *)local_138,(size_t *)0x0,10);
                  CheckParenthesis(this,(uint)uVar9);
                  goto LAB_00122519;
                }
                std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
                lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
                if (lVar7 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Comma not defined correctly",0x1b);
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  goto LAB_00122519;
                }
                std::__cxx11::string::substr((ulong)local_f8,(ulong)local_138);
                std::__cxx11::string::substr((ulong)local_118,(ulong)local_138);
                uVar9 = std::__cxx11::stoul((string *)local_f8,(size_t *)0x0,10);
                uVar8 = std::__cxx11::stoul((string *)local_118,(size_t *)0x0,10);
                CheckComma(this,(uint)uVar9,(uint)uVar8);
              }
            }
LAB_001224f3:
            if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_);
            }
          }
        }
LAB_0012250f:
        if ((Parser *)local_f8._0_8_ != (Parser *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_);
        }
LAB_00122519:
        if ((Parser *)local_138._0_8_ != (Parser *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
        return false;
      }
      std::__cxx11::string::string((string *)local_138,value,(allocator *)local_f8);
      std::__cxx11::string::string((string *)local_f8,value,(allocator *)local_118);
      local_118._0_8_ = (Parser *)(local_118 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"0","");
      lVar7 = std::__cxx11::string::find(local_138,0x16b0b1,0);
      if (lVar7 != -1) {
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
        std::__cxx11::string::operator=((string *)local_f8,(string *)local_d8);
        if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_138);
        std::__cxx11::string::operator=((string *)local_118,(string *)local_d8);
        if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
      uVar10 = local_f8._0_8_;
      std::__cxx11::string::string((string *)local_d8,(char *)local_118._0_8_,(allocator *)local_b8)
      ;
      uVar9 = std::__cxx11::stoul((string *)local_d8,(size_t *)0x0,10);
      CheckFunctions(this,(char *)uVar10,uVar9);
      if ((Parser *)local_d8._0_8_ != (Parser *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
      if ((Parser *)local_118._0_8_ != (Parser *)(local_118 + 0x10)) goto LAB_001216ef;
    }
  }
  if ((Parser *)local_f8._0_8_ != (Parser *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_);
  }
LAB_0012168f:
  if ((Parser *)local_138._0_8_ != (Parser *)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_);
  }
  return true;
}

Assistant:

bool Parser::Check(const char* name, const char* value)
{
  if(!strcmp(name,"LineLength"))
    {
    this->CheckLineLength(std::stoul(value));
    return true;
    }
  else if(m_Positions.empty())
    {
    this->CheckLineLength(0,false,false); // run CheckLineLength without errors to fill m_Positions
    }
  if(!strcmp(name,"DeclarationOrder"))
    {
    this->CheckDeclarationOrder(std::stoul(&value[0]),std::stoul(&value[2]),std::stoul(&value[4]));
    return true;
    }
  if(!strcmp(name,"Typedefs"))
    {
    bool alignment = true; // check alignment by default
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      std::string v1 = val.substr(0,pos);

      // Check the alignment
      size_t pos1 = val.find(",",pos+1);

      std::string v2 = "";
      if(pos1 == std::string::npos)
        {
        v2 = val.substr(pos+1,val.size()-pos-1);
        }
      else
        {
        v2 = val.substr(pos+1,pos1-pos-1);
        }

      if(!strcmp(v2.c_str(),"false") || !strcmp(v2.c_str(),"0"))
        {
        alignment = false;
        }
      val = v1;
      }

    this->CheckTypedefs(val.c_str(),alignment);
    return true;
    }
  if(!strcmp(name,"InternalVariables"))
    {
    bool alignment = true; // check alignment by default
    bool checkProtected = false; // check protected by default
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      std::string v1 = val.substr(0,pos);

      // Check the alignment
      size_t pos1 = val.find(",",pos+1);

      std::string v2 = "";
      if(pos1 == std::string::npos)
        {
        v2 = val.substr(pos+1,val.size()-pos-1);
        }
      else
        {
        v2 = val.substr(pos+1,pos1-pos-1);
        }

      if(!strcmp(v2.c_str(),"false") || !strcmp(v2.c_str(),"0"))
        {
        alignment = false;
        }

      if(pos1 != std::string::npos)
        {
        // Check the protected
        pos = val.find(",",pos1+1);
        std::string v3 = "";
        if(pos == std::string::npos)
          {
          v3 = val.substr(pos1+1,val.size()-pos1-1);
          }
        else
          {
          v3 = val.substr(pos1+1,pos-pos1-1);
          }

        if(!strcmp(v3.c_str(),"true") || !strcmp(v3.c_str(),"1"))
          {
          checkProtected = true;
          }
        }
      val = v1;
      }

    this->CheckInternalVariables(val.c_str(),alignment,checkProtected);

    return true;
    }
  if(!strcmp(name,"Variables"))
    {
    this->CheckVariables(value);
    return true;
    }
  if(!strcmp(name,"Struct"))
    {
    this->CheckStruct(value);
    return true;
    }
  if(!strcmp(name,"MemberFunctions"))
    {
    std::string val = value;
    std::string v1 = value;
    std::string v2 = "0";
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      v2 = val.substr(pos+1,val.size()-pos-1);
      }
    this->CheckMemberFunctions(v1.c_str(),std::stoul(v2.c_str()));
    return true;
    }
  if(!strcmp(name,"Functions"))
    {
    std::string val = value;
    std::string v1 = value;
    std::string v2 = "0";
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      v2 = val.substr(pos+1,val.size()-pos-1);
      }
    this->CheckFunctions(v1.c_str(),std::stoul(v2.c_str()));
    return true;
    }
  if(!strcmp(name,"SemicolonSpace"))
    {
    this->CheckSemicolonSpace(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"EndOfFileNewLine"))
    {
    this->CheckEndOfFileNewLine();
    return true;
    }
  if(!strcmp(name,"Tabs"))
    {
    this->CheckTabs();
    return true;
    }
  if(!strcmp(name,"Spaces"))
    {
    this->CheckExtraSpaces(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"StatementPerLine"))
    {
    std::string val = value;
    std::string v1 = value;
    size_t pos = val.find(",",0);
    bool checkInlineFunctions = true;
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      std::string v2 = val.substr(pos+1,val.size()-pos-1);
      if(v2 == "0")
        {
        checkInlineFunctions = false;
        }
      }

    this->CheckStatementPerLine(std::stoul(v1.c_str()),checkInlineFunctions);
    return true;
    }
 if(!strcmp(name,"BadCharacters"))
    {
    this->CheckBadCharacters(!strcmp(value,"true"));
    return true;
    }
  if(!strcmp(name,"VariablePerLine"))
    {
    this->CheckVariablePerLine(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"Comments"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    auto pos1 = val.find(",", pos + 1);
    if(pos1 == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v2 = val.substr(pos+1,pos1-pos-1);
    pos = val.find(",",pos1+1);
    if(pos == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v3 = val.substr(pos1+1,pos-pos1-1);

    // Check if we allow empty lines before /class
    pos1 = val.find(",",pos+1);
    std::string v4 = "";
    if(pos1 == std::string::npos)
      {
      v4 = val.substr(pos+1,val.length()-pos-1);
      }
    else
      {
      v4 = val.substr(pos+1,pos1-pos-1);
      }

    bool allowEmptyLine = !strcmp(v4.c_str(),"true");

    // Check if we should check the comments misspeling
    pos = val.find(",",pos1+1);
    std::string v5 = "";
    if(pos == std::string::npos)
      {
      v5 = val.substr(pos1+1,val.length()-pos1-1);
      }
    else
      {
      v5 = val.substr(pos1+1,pos-pos1-1);
      }

    bool checkWrongComment = true;
    if(!strcmp(v5.c_str(),"false"))
      {
      checkWrongComment = false;
      }

    // Check if we should check the missing comments
    pos1 = val.find(",",pos+1);
    std::string v6 = "";
    if(pos == std::string::npos)
      {
      v6 = val.substr(pos+1,val.length()-pos-1);
      }
    else
      {
      v6 = val.substr(pos+1,pos1-pos-1);
      }

    bool checkMissingComment = true;
    if(!strcmp(v6.c_str(),"false"))
      {
      checkMissingComment = false;
      }

    this->CheckComments(v1.c_str(),v2.c_str(),v3.c_str(),allowEmptyLine,checkWrongComment,checkMissingComment);

    return true;
    }
  // should be before CheckIndent
  else if(!strcmp(name,"Header"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Header not defined correctly" << std::endl;
      return false;
      }

    std::string v1 = "";
    if(pos>0)
      {
      v1 = val.substr(0,pos);
      }

      auto pos1 = val.find(",", pos + 1);
      if (pos1 == std::string::npos) {
        std::cout << "Header not defined correctly" << std::endl;
        return false;
      }

    std::string v2 = val.substr(pos+1,pos1-pos-1);
    std::string v3 = val.substr(pos1+1,val.length()-pos1-1);

    bool spaceEndOfLine = false;
    bool useCVS = false;

    if(!strcmp(v2.c_str(),"true"))
      {
      spaceEndOfLine = true;
      }
    if(!strcmp(v3.c_str(),"true"))
      {
      useCVS = true;
      }

      if (!v1.empty()) {
        this->CheckHeader(v1.c_str(), spaceEndOfLine, useCVS);
      }
    }

   else if(!strcmp(name,"Indent"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    auto pos1 = val.find(",", pos + 1);
    if(pos1 == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v2 = val.substr(pos+1,pos1-pos-1);
    pos = val.find(",",pos1+1);
    if(pos == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v3 = val.substr(pos1+1,pos-pos1-1);
    std::string v4 = val.substr(pos+1,val.length()-pos-1);
    bool header = false;
    if(!strcmp(v3.c_str(),"true"))
      {
      header = true;
      }
    bool blockline = false;
    if(!strcmp(v4.c_str(),"true"))
      {
      blockline = true;
      }

    IndentType itype = kws::SPACE;

    if(!strcmp(v1.c_str(),"TAB"))
      {
      itype = kws::TAB;
      }
    this->CheckIndent(itype,std::stoul(v2.c_str()),header,blockline);
    }

  else if(!strcmp(name,"Namespace"))
    {
    this->CheckNamespace(value);
    }
  else if(!strcmp(name,"NameOfClass"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "NameOfClass not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckNameOfClass(v1.c_str(),v2.c_str());
    }
  else if(!strcmp(name,"IfNDefDefine"))
    {
    std::string val = value;
    std::string v1 = value;
    bool uppercaseTheDefinition = false;
    const size_t pos = val.find(",", 0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0, pos);
      std::string v2 = val.substr(pos+1);
      uppercaseTheDefinition = !v2.compare("true") || !v2.compare("1");
      }
    this->CheckIfNDefDefine(v1.c_str(), uppercaseTheDefinition);
    }
  else if(!strcmp(name,"EmptyLines"))
    {
    this->CheckEmptyLines(std::stoul(value));
    }
  else if(!strcmp(name,"Template"))
    {
    this->CheckTemplate(value);
    }
  else if(!strcmp(name,"Operator"))
    {
    std::string val = value;
    const size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Operator not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckOperator(std::stoul(v1),std::stoul(v2));
    }
  else if(!strcmp(name,"Comma"))
    {
    std::string val = value;
    const size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Comma not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckComma(std::stoul(v1),std::stoul(v2));
    }
  else if(!strcmp(name,"Parenthesis"))
    {
    this->CheckParenthesis(std::stoul(value));
    }
  else if(!strcmp(name,"IfWhileForUntil"))
    {
    this->CheckIfWhileForUntil(std::stoul(value));
    }
  else if(!strcmp(name,"BlackList"))
    {
    this->CheckBlackList(value);
    }
  else if(!strcmp(name, "UsingDirectives"))
    {
    bool forbidUsingDirectives = true;
    if( !strcmp(value, "0") || !strcmp(value, "false"))
      forbidUsingDirectives = false;
    this->CheckUsingDirectives(forbidUsingDirectives);
    }
  else if(!strcmp(name, "RelativePathInInclude"))
    {
    bool forbidRelativePaths = true;
    if( !strcmp(value, "0") || !strcmp(value, "false"))
      forbidRelativePaths = false;
    this->CheckRelativePathInInclude(forbidRelativePaths);
    }
  return false;
}